

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int inherit_config_flag(lys_node *node,int flags,int clear)

{
  ly_ctx *ctx_00;
  int iVar1;
  ly_ctx *ctx;
  lys_node_leaf *leaf;
  int clear_local;
  int flags_local;
  lys_node *node_local;
  
  if (node != (lys_node *)0x0) {
    if (flags != (flags & 3U)) {
      __assert_fail("!(flags ^ (flags & LYS_CONFIG_MASK))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0x125c,"int inherit_config_flag(struct lys_node *, int, int)");
    }
    ctx_00 = node->module->ctx;
    for (_clear_local = (lys_node_leaf *)node; _clear_local != (lys_node_leaf *)0x0;
        _clear_local = (lys_node_leaf *)_clear_local->next) {
      if (clear == 0) {
        if ((_clear_local->flags & 4) == 0) {
          if (((((_clear_local->nodetype & (LYS_USES|LYS_GROUPING)) == LYS_UNKNOWN) &&
               (_clear_local->flags = _clear_local->flags & 0xfffc | (ushort)flags,
               _clear_local->nodetype == LYS_LIST)) && ((_clear_local->flags & 1) != 0)) &&
             (_clear_local->padding[2] == '\0')) {
            ly_vlog(ctx_00,LYE_MISSCHILDSTMT,LY_VLOG_LYS,_clear_local,"key","list");
            return -1;
          }
          goto LAB_0011b789;
        }
        if (((flags & 2U) != 0) && ((_clear_local->flags & 1) != 0)) {
          ly_vlog(ctx_00,LYE_INARG,LY_VLOG_LYS,_clear_local,"true","config");
          ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                  "State nodes cannot have configuration nodes as children.");
          return -1;
        }
      }
      else {
        _clear_local->flags = _clear_local->flags & 0xfffc;
        _clear_local->flags = _clear_local->flags & 0xfffb;
LAB_0011b789:
        if ((_clear_local->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          iVar1 = inherit_config_flag((lys_node *)_clear_local->backlinks,flags,clear);
          if (iVar1 != 0) {
            return -1;
          }
        }
        else if (((_clear_local->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
                (iVar1 = check_leafref_config(_clear_local,&_clear_local->type), iVar1 != 0)) {
          return -1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int
inherit_config_flag(struct lys_node *node, int flags, int clear)
{
    struct lys_node_leaf *leaf;
    struct ly_ctx *ctx;

    if (!node) {
        return 0;
    }

    assert(!(flags ^ (flags & LYS_CONFIG_MASK)));
    ctx = node->module->ctx;

    LY_TREE_FOR(node, node) {
        if (clear) {
            node->flags &= ~LYS_CONFIG_MASK;
            node->flags &= ~LYS_CONFIG_SET;
        } else {
            if (node->flags & LYS_CONFIG_SET) {
                /* skip nodes with an explicit config value */
                if ((flags & LYS_CONFIG_R) && (node->flags & LYS_CONFIG_W)) {
                    LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, node, "true", "config");
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
                    return -1;
                }
                continue;
            }

            if (!(node->nodetype & (LYS_USES | LYS_GROUPING))) {
                node->flags = (node->flags & ~LYS_CONFIG_MASK) | flags;
                /* check that configuration lists have keys */
                if ((node->nodetype == LYS_LIST) && (node->flags & LYS_CONFIG_W)
                        && !((struct lys_node_list *)node)->keys_size) {
                    LOGVAL(ctx, LYE_MISSCHILDSTMT, LY_VLOG_LYS, node, "key", "list");
                    return -1;
                }
            }
        }
        if (!(node->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA))) {
            if (inherit_config_flag(node->child, flags, clear)) {
                return -1;
            }
        } else if (node->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
            leaf = (struct lys_node_leaf *)node;
            if (check_leafref_config(leaf, &leaf->type)) {
                return -1;
            }
        }
    }

    return 0;
}